

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_GetVariableIntTest_Test::TestBody(ByteData_GetVariableIntTest_Test *this)

{
  allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  pointer ppVar4;
  char *pcVar5;
  char *rhs;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3c8;
  AssertHelper local_378;
  Message local_370;
  string local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar;
  Message local_330 [2];
  ByteData local_320;
  _Self local_308;
  _Self local_300;
  const_iterator citr;
  ByteData var_int_bytes;
  unsigned_long local_2d8;
  unsigned_long local_2d0;
  unsigned_long local_2c8;
  ulong local_2c0;
  unsigned_long local_2b8;
  unsigned_long local_2b0;
  ulong local_2a8;
  unsigned_long local_2a0 [4];
  int local_280 [5];
  int local_26c;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_268;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_58 [24];
  map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_vector;
  uint8_t vi_max8;
  ByteData_GetVariableIntTest_Test *this_local;
  
  test_vector._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0xfc;
  local_268 = &local_260;
  local_26c = 0;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[3],_true>(local_268,&local_26c,(char (*) [3])0x88c486);
  local_268 = &local_238;
  local_280[0] = 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[3],_true>(local_268,local_280,(char (*) [3])0x773453);
  local_268 = &local_210;
  local_2a0[3] = 0xfb;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[3],_true>(local_268,local_2a0 + 3,(char (*) [3])0x722aa3);
  local_268 = &local_1e8;
  local_2a0[2] = 0xfc;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[3],_true>(local_268,local_2a0 + 2,(char (*) [3])0x76b27f);
  local_268 = &local_1c0;
  local_2a0[1] = 0xfd;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>(local_268,local_2a0 + 1,(char (*) [7])"fdfd00");
  local_268 = &local_198;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  local_2a0[0] = (ulong)uVar2 - 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>(&local_198,local_2a0,(char (*) [7])"fdfeff");
  local_268 = &local_170;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  local_2a8 = (ulong)uVar2;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>(&local_170,&local_2a8,(char (*) [7])"fdffff");
  local_268 = &local_148;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  local_2b0 = (ulong)uVar2 + 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>(&local_148,&local_2b0,(char (*) [11])"fe00000100")
  ;
  local_268 = &local_120;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  local_2b8 = (ulong)uVar3 - 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>(&local_120,&local_2b8,(char (*) [11])"fefeffffff")
  ;
  local_268 = &local_f8;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  local_2c0 = (ulong)uVar3;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>(&local_f8,&local_2c0,(char (*) [11])"feffffffff");
  local_268 = &local_d0;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  local_2c8 = (ulong)uVar3 + 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>
            (&local_d0,&local_2c8,(char (*) [19])"ff0000000001000000");
  local_268 = &local_a8;
  local_2d0 = std::numeric_limits<unsigned_long>::max();
  local_2d0 = local_2d0 - 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>
            (&local_a8,&local_2d0,(char (*) [19])"fffeffffffffffffff");
  local_268 = &local_80;
  local_2d8 = std::numeric_limits<unsigned_long>::max();
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>(&local_80,&local_2d8,(char (*) [19])0x6d6203);
  local_58._0_8_ = &local_260;
  local_58._8_8_ = 0xd;
  this_00 = (allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&var_int_bytes.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6);
  std::
  allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this_00);
  __l._M_len = local_58._8_8_;
  __l._M_array = (iterator)local_58._0_8_;
  std::
  map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_58 + 0x10),__l,
        (less<const_unsigned_long> *)
        ((long)&var_int_bytes.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::
  allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&var_int_bytes.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 6));
  local_3c8 = (pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58;
  do {
    local_3c8 = local_3c8 + -1;
    std::
    pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_3c8);
  } while (local_3c8 != &local_260);
  cfd::core::ByteData::ByteData((ByteData *)&citr);
  local_300._M_node =
       (_Base_ptr)
       std::
       map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::cbegin((map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_58 + 0x10));
  while( true ) {
    local_308._M_node =
         (_Base_ptr)
         std::
         map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::cend((map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_58 + 0x10));
    bVar1 = std::operator!=(&local_300,&local_308);
    if (!bVar1) break;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_300);
        cfd::core::ByteData::GetVariableInt(&local_320,ppVar4->first);
        cfd::core::ByteData::operator=((ByteData *)&citr,&local_320);
        cfd::core::ByteData::~ByteData(&local_320);
      }
    }
    else {
      testing::Message::Message(local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xb3,
                 "Expected: var_int_bytes = ByteData::GetVariableInt(citr->first) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_330);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_368,(ByteData *)&citr);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_300);
    rhs = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_348,"var_int_bytes.GetHex().c_str()","citr->second.c_str()",pcVar5,
               rhs);
    std::__cxx11::string::~string((string *)&local_368);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar1) {
      testing::Message::Message(&local_370);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xb4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_378,&local_370);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_300);
  }
  cfd::core::ByteData::~ByteData((ByteData *)&citr);
  std::
  map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_58 + 0x10));
  return;
}

Assistant:

TEST(ByteData, GetVariableIntTest) {
  const uint8_t vi_max8 = 252;
  std::map<const uint64_t, const std::string> test_vector = {
    {0, "00"},
    {1, "01"},
    {static_cast<uint64_t>(vi_max8)-1, "fb"},
    {static_cast<uint64_t>(vi_max8), "fc"},
    {static_cast<uint64_t>(vi_max8)+1, "fdfd00"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())-1, "fdfeff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max()), "fdffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())+1, "fe00000100"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())-1, "fefeffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max()), "feffffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())+1, "ff0000000001000000"},
    {std::numeric_limits<uint64_t>::max()-1, "fffeffffffffffffff"},
    {std::numeric_limits<uint64_t>::max(), "ffffffffffffffffff"},
  };

  ByteData var_int_bytes;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(var_int_bytes = ByteData::GetVariableInt(citr->first));
    EXPECT_STREQ(var_int_bytes.GetHex().c_str(), citr->second.c_str());
    ++citr;
  }
}